

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

size_t printArg(OPTYPE *pMyOperand,PDISASM pMyDisasm,size_t i)

{
  size_t sVar1;
  
  if (pMyOperand->OpMnemonic[0] != '\0') {
    (pMyDisasm->CompleteInstr + i)[0] = ' ';
    (pMyDisasm->CompleteInstr + i)[1] = '\0';
    sVar1 = strlen(pMyDisasm->CompleteInstr);
    strcpy(pMyDisasm->CompleteInstr + sVar1,pMyOperand->OpMnemonic);
    sVar1 = strlen(pMyDisasm->CompleteInstr);
    return sVar1;
  }
  return i;
}

Assistant:

size_t __bea_callspec__ printArg(OPTYPE* pMyOperand, PDISASM pMyDisasm, size_t i)
{
  size_t mnemonic = strlen((char*) &pMyOperand->OpMnemonic);
  if (mnemonic != 0) {
    i = printOneSpace(pMyDisasm, i);
    (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, (char*) &pMyOperand->OpMnemonic);
    i = strlen((char*) &pMyDisasm->CompleteInstr);
  }
  return i;
}